

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void put1bitcmaptile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                    int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  uint32_t **ppuVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t *puVar5;
  
  if (h != 0) {
    ppuVar2 = img->PALmap;
    iVar4 = fromskew + 7;
    if (-1 < fromskew) {
      iVar4 = fromskew;
    }
    do {
      uVar3 = w;
      if (7 < w) {
        do {
          bVar1 = *pp;
          pp = pp + 1;
          puVar5 = ppuVar2[bVar1];
          *cp = *puVar5;
          cp[1] = puVar5[1];
          cp[2] = puVar5[2];
          cp[3] = puVar5[3];
          cp[4] = puVar5[4];
          cp[5] = puVar5[5];
          cp[6] = puVar5[6];
          cp[7] = puVar5[7];
          cp = cp + 8;
          uVar3 = uVar3 - 8;
        } while (7 < uVar3);
      }
      if (uVar3 != 0) {
        puVar5 = ppuVar2[*pp];
        switch(uVar3) {
        case 7:
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar3;
          cp = cp + 1;
        case 6:
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar3;
          cp = cp + 1;
        case 5:
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar3;
          cp = cp + 1;
        case 4:
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar3;
          cp = cp + 1;
        case 3:
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar3;
          cp = cp + 1;
        case 2:
          uVar3 = *puVar5;
          puVar5 = puVar5 + 1;
          *cp = uVar3;
          cp = cp + 1;
        case 1:
          pp = pp + 1;
          *cp = *puVar5;
          cp = cp + 1;
        }
      }
      pp = pp + (iVar4 >> 3);
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put1bitcmaptile)
{
    uint32_t **PALmap = img->PALmap;

    (void)x;
    (void)y;
    fromskew /= 8;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL8(w, bw = PALmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}